

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

void __thiscall State::Dump(State *this)

{
  _Hash_node_base _Var1;
  _Base_ptr p_Var2;
  char *pcVar3;
  __node_base *p_Var4;
  
  p_Var4 = &(this->paths_)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var4[3]._M_nxt;
    pcVar3 = "unknown";
    if ((_Var1._M_nxt[5]._M_nxt != (_Hash_node_base *)0xffffffffffffffff) &&
       (pcVar3 = "clean", *(char *)&_Var1._M_nxt[6]._M_nxt != '\0')) {
      pcVar3 = "dirty";
    }
    printf("%s %s [id:%d]\n",(_Var1._M_nxt)->_M_nxt,pcVar3,(ulong)*(uint *)&_Var1._M_nxt[0xb]._M_nxt
          );
  }
  if ((this->pools_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    puts("resource_pools:");
    for (p_Var2 = (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->pools_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (((*(Pool **)(p_Var2 + 2))->name_)._M_string_length != 0) {
        Pool::Dump(*(Pool **)(p_Var2 + 2));
      }
    }
  }
  return;
}

Assistant:

void State::Dump() {
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    Node* node = i->second;
    printf("%s %s [id:%d]\n",
           node->path().c_str(),
           node->status_known() ? (node->dirty() ? "dirty" : "clean")
                                : "unknown",
           node->id());
  }
  if (!pools_.empty()) {
    printf("resource_pools:\n");
    for (map<string, Pool*>::const_iterator it = pools_.begin();
         it != pools_.end(); ++it)
    {
      if (!it->second->name().empty()) {
        it->second->Dump();
      }
    }
  }
}